

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int exprIdxCover(Walker *pWalker,Expr *pExpr)

{
  i16 iVar1;
  char *in_RSI;
  long in_RDI;
  
  if (((*in_RSI == -0x62) && (*(int *)(in_RSI + 0x2c) == *(int *)(*(long *)(in_RDI + 0x28) + 8))) &&
     (iVar1 = sqlite3ColumnOfIndex
                        ((Index *)**(undefined8 **)(in_RDI + 0x28),*(i16 *)(in_RSI + 0x30)),
     iVar1 < 0)) {
    *(undefined1 *)(in_RDI + 0x24) = 1;
    return 2;
  }
  return 0;
}

Assistant:

static int exprIdxCover(Walker *pWalker, Expr *pExpr){
  if( pExpr->op==TK_COLUMN
   && pExpr->iTable==pWalker->u.pIdxCover->iCur
   && sqlite3ColumnOfIndex(pWalker->u.pIdxCover->pIdx, pExpr->iColumn)<0
  ){
    pWalker->eCode = 1;
    return WRC_Abort;
  }
  return WRC_Continue;
}